

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

TargetOrString * __thiscall
cmGeneratorTarget::ResolveTargetReference
          (TargetOrString *__return_storage_ptr__,cmGeneratorTarget *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  cmLocalGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmLocalGenerator *this_00;
  cmDirectoryId dirId;
  string plainName;
  cmDirectoryId local_90;
  string local_70;
  string local_50;
  
  this_00 = this->LocalGenerator;
  lVar2 = std::__cxx11::string::find((char *)name,0x555b14,0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)name);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    paVar1 = &local_90.String.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.String._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.String._M_dataplus._M_p,
                      local_90.String.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
    cmDirectoryId::cmDirectoryId(&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = cmGlobalGenerator::FindLocalGenerator(this->GlobalGenerator,&local_90);
    if (pcVar3 != (cmLocalGenerator *)0x0) {
      this_00 = pcVar3;
      name = &local_70;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.String._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.String._M_dataplus._M_p,
                      local_90.String.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->String)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->String).field_2;
  (__return_storage_ptr__->String)._M_string_length = 0;
  (__return_storage_ptr__->String).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Target = (cmGeneratorTarget *)0x0;
  pcVar4 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
  if (pcVar4 == (cmGeneratorTarget *)0x0) {
    if (name == &local_70) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  else {
    __return_storage_ptr__->Target = pcVar4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::TargetOrString cmGeneratorTarget::ResolveTargetReference(
  std::string const& name) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  std::string const* lookupName = &name;

  // When target_link_libraries() is called with a LHS target that is
  // not created in the calling directory it adds a directory id suffix
  // that we can use to look up the calling directory.  It is that scope
  // in which the item name is meaningful.  This case is relatively rare
  // so we allocate a separate string only when the directory id is present.
  std::string::size_type pos = name.find(CMAKE_DIRECTORY_ID_SEP);
  std::string plainName;
  if (pos != std::string::npos) {
    // We will look up the plain name without the directory id suffix.
    plainName = name.substr(0, pos);

    // We will look up in the scope of the directory id.
    // If we do not recognize the id then leave the original
    // syntax in place to produce an indicative error later.
    cmDirectoryId const dirId =
      name.substr(pos + sizeof(CMAKE_DIRECTORY_ID_SEP) - 1);
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      lookupName = &plainName;
    }
  }

  TargetOrString resolved;

  if (cmGeneratorTarget* tgt = lg->FindGeneratorTargetToUse(*lookupName)) {
    resolved.Target = tgt;
  } else if (lookupName == &plainName) {
    resolved.String = std::move(plainName);
  } else {
    resolved.String = name;
  }

  return resolved;
}